

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::dataJointArray
          (LibraryControllersLoader *this,ParserString *data,size_t length)

{
  size_t *psVar1;
  StringList *pSVar2;
  _List_node_base *p_Var3;
  size_t *psVar4;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  if (length != 0 && this->mJointSidsOrIds != (StringList *)0x0) {
    psVar4 = &(data->super_UnionString).length;
    do {
      pSVar2 = this->mJointSidsOrIds;
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,((UnionString *)(psVar4 + -1))->str,
                 ((UnionString *)(psVar4 + -1))->str + *psVar4);
      p_Var3 = (_List_node_base *)operator_new(0x30);
      p_Var3[1]._M_next = p_Var3 + 2;
      if (local_50 == &local_40) {
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
        p_Var3[2]._M_prev = local_40._M_prev;
      }
      else {
        p_Var3[1]._M_next = local_50;
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
      }
      p_Var3[1]._M_prev = local_48;
      local_48 = (_List_node_base *)0x0;
      local_40._M_next._0_1_ = 0;
      local_50 = &local_40;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(pSVar2->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_) + 1);
      }
      psVar4 = psVar4 + 2;
      length = length - 1;
    } while (length != 0);
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::dataJointArray( const ParserString* data, size_t length )
	{
		if ( !mJointSidsOrIds )
			return true;

		for ( size_t i = 0; i < length;  ++i)
		{
			const ParserString& parserString = data[i];
			mJointSidsOrIds->push_back( String( parserString.str, parserString.length ) );
		}
		return true;
	}